

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

bool __thiscall dgPolyhedra::GetConectedSurface(dgPolyhedra *this,dgPolyhedra *polyhedra)

{
  int iVar1;
  dgTreeNode *this_00;
  HaI32 *pHVar2;
  long lVar3;
  dgRedBackNode *pdVar4;
  undefined8 *__ptr;
  long lVar5;
  HaI32 *pHVar6;
  int iVar7;
  int iVar8;
  HaI32 faceIndex [4096];
  HaI64 faceDataIndex [4096];
  Iterator local_c048;
  HaI32 local_c038 [4096];
  HaI64 local_8038 [4097];
  
  if (((this->super_dgTree<dgEdge,_long>).m_count != 0) &&
     (this_00 = (this->super_dgTree<dgEdge,_long>).m_head, this_00 != (dgTreeNode *)0x0)) {
    local_c048.m_tree = &this->super_dgTree<dgEdge,_long>;
    pdVar4 = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
    while (pdVar4 != (dgRedBackNode *)0x0) {
      local_c048.m_ptr = pdVar4;
      if ((*(int *)&pdVar4[2]._vptr_dgRedBackNode < this->m_baseMark) &&
         (0 < *(int *)((long)&pdVar4[1]._vptr_dgRedBackNode + 4))) {
        iVar7 = (this->super_dgTree<dgEdge,_long>).m_count;
        __ptr = (undefined8 *)malloc((long)(iVar7 * 8));
        if (iVar7 < 0) {
          __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                        ,0x60,"T &dgStack<dgEdge *>::operator[](hacd::HaI32) [T = dgEdge *]");
        }
        iVar7 = this->m_edgeMark + 1;
        this->m_edgeMark = iVar7;
        if (iVar7 != 0x7fffffff) {
          *__ptr = pdVar4 + 1;
          iVar8 = 1;
          do {
            lVar5 = (long)iVar8;
            iVar8 = iVar8 + -1;
            pHVar2 = (HaI32 *)__ptr[lVar5 + -1];
            if (pHVar2[10] != iVar7) {
              iVar1 = (this->super_dgTree<dgEdge,_long>).m_count;
              lVar5 = 0;
              pHVar6 = pHVar2;
              do {
                pHVar6[10] = iVar7;
                local_c038[lVar5] = *pHVar6;
                local_8038[lVar5] = *(HaI64 *)(pHVar6 + 2);
                if (lVar5 == 0xfff) {
                  __assert_fail("count < hacd::HaI32 ((sizeof (faceIndex)/sizeof(faceIndex[0])))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                ,0x8cb,"bool dgPolyhedra::GetConectedSurface(dgPolyhedra &) const");
                }
                lVar3 = *(long *)(pHVar6 + 8);
                if ((0 < *(int *)(lVar3 + 4)) && (*(int *)(lVar3 + 0x28) != iVar7)) {
                  __ptr[iVar8] = lVar3;
                  iVar8 = iVar8 + 1;
                  if (iVar1 <= iVar8) {
                    __assert_fail("index < GetCount()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                  ,0x8d0,"bool dgPolyhedra::GetConectedSurface(dgPolyhedra &) const"
                                 );
                  }
                }
                pHVar6 = *(HaI32 **)(pHVar6 + 4);
                lVar5 = lVar5 + 1;
              } while (pHVar6 != pHVar2);
              AddFace(polyhedra,(HaI32)lVar5,local_c038,local_8038);
            }
          } while (iVar8 != 0);
          EndFace(polyhedra);
          free(__ptr);
          return true;
        }
        __assert_fail("m_edgeMark < 0x7fffffff",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                      ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
      }
      dgTree<dgEdge,_long>::Iterator::operator++(&local_c048,0);
      pdVar4 = local_c048.m_ptr;
    }
  }
  return false;
}

Assistant:

bool dgPolyhedra::GetConectedSurface (dgPolyhedra &polyhedra) const
{
	if (!GetCount()) {
		return false;
	}

	dgEdge* edge = NULL;
	Iterator iter(*this);
	for (iter.Begin (); iter; iter ++) {
		edge = &(*iter);
		if ((edge->m_mark < m_baseMark) && (edge->m_incidentFace > 0)) {
			break;
		}
	}

	if (!iter) {
		return false;
	}

	hacd::HaI32 faceIndex[4096];
	hacd::HaI64 faceDataIndex[4096];
	dgStack<dgEdge*> stackPool (GetCount()); 
	dgEdge** const stack = &stackPool[0];

	hacd::HaI32 mark = IncLRU();

	polyhedra.BeginFace ();
	stack[0] = edge;
	hacd::HaI32 index = 1;
	while (index) {
		index --;
		dgEdge* const edge = stack[index];

		if (edge->m_mark == mark) {
			continue;
		}

		hacd::HaI32 count = 0;
		dgEdge* ptr = edge;
		do {
			ptr->m_mark = mark;
			faceIndex[count] = ptr->m_incidentVertex;
			faceDataIndex[count] = hacd::HaI64 (ptr->m_userData);
			count ++;
			HACD_ASSERT (count <  hacd::HaI32 ((sizeof (faceIndex)/sizeof(faceIndex[0]))));

			if ((ptr->m_twin->m_incidentFace > 0) && (ptr->m_twin->m_mark != mark)) {
				stack[index] = ptr->m_twin;
				index ++;
				HACD_ASSERT (index < GetCount());
			}

			ptr = ptr->m_next;
		} while (ptr != edge);

		polyhedra.AddFace (count, &faceIndex[0], &faceDataIndex[0]);
	}

	polyhedra.EndFace ();

	return true;
}